

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

int __thiscall
mp::internal::BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>
          (BinaryReader<mp::internal::EndiannessConverter> *this)

{
  int iVar1;
  char *pcVar2;
  undefined8 *in_RDI;
  BinaryReaderBase *unaff_retaddr;
  int val;
  undefined4 in_stack_fffffffffffffff0;
  
  in_RDI[3] = *in_RDI;
  pcVar2 = BinaryReaderBase::Read(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  iVar1 = EndiannessConverter::Convert<int>
                    ((EndiannessConverter *)
                     CONCAT44(*(undefined4 *)pcVar2,in_stack_fffffffffffffff0),
                     (int)((ulong)in_RDI >> 0x20));
  return iVar1;
}

Assistant:

Int ReadInt() {
    token_ = ptr_;
    Int val;
    memcpy(&val, Read(sizeof(Int)), sizeof(Int));
    return this->Convert(val);
  }